

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibrary.cpp
# Opt level: O0

void __thiscall deqp::sl::ShaderParser::advanceToken(ShaderParser *this)

{
  char *__s2;
  deBool dVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  size_t __n;
  bool bVar6;
  int local_108;
  allocator local_101;
  int ndx_1;
  char *local_e0;
  char *p_2;
  string local_d0 [6];
  char endChar;
  char *local_b0;
  char *p_1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [32];
  char *local_58;
  char *p;
  int ndx;
  allocator local_39;
  string local_38 [32];
  char *local_18;
  char *end;
  ShaderParser *this_local;
  
  end = (char *)this;
  lVar3 = std::__cxx11::string::length();
  this->m_curPtr = this->m_curPtr + lVar3;
  this->m_curToken = TOKEN_INVALID;
  std::__cxx11::string::operator=((string *)&this->m_curTokenStr,"");
  while( true ) {
    while (dVar1 = isWhitespace(*this->m_curPtr), dVar1 != 0) {
      this->m_curPtr = this->m_curPtr + 1;
    }
    if (*this->m_curPtr != '#') break;
    while( true ) {
      bVar6 = false;
      if (*this->m_curPtr != '\0') {
        dVar1 = isEOL(*this->m_curPtr);
        bVar6 = dVar1 == 0;
      }
      if (!bVar6) break;
      this->m_curPtr = this->m_curPtr + 1;
    }
  }
  if (*this->m_curPtr == '\0') {
    this->m_curToken = TOKEN_EOF;
    std::__cxx11::string::operator=((string *)&this->m_curTokenStr,"<EOF>");
  }
  else {
    dVar1 = isAlpha(*this->m_curPtr);
    if (dVar1 == 0) {
      dVar1 = isNumeric(*this->m_curPtr);
      if (dVar1 == 0) {
        if ((*this->m_curPtr == '\"') && (this->m_curPtr[1] == '\"')) {
          local_b0 = this->m_curPtr + 2;
          while( true ) {
            bVar6 = true;
            if (*local_b0 == '\"') {
              bVar6 = local_b0[1] != '\"';
            }
            if (!bVar6) break;
            if (*local_b0 == '\\') {
              local_b0 = local_b0 + 2;
            }
            else {
              local_b0 = local_b0 + 1;
            }
          }
          local_b0 = local_b0 + 2;
          this->m_curToken = TOKEN_SHADER_SOURCE;
          pcVar5 = this->m_curPtr;
          iVar2 = (int)local_b0 - (int)pcVar5;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_d0,pcVar5,(long)iVar2,(allocator *)((long)&p_2 + 7));
          std::__cxx11::string::operator=((string *)&this->m_curTokenStr,local_d0);
          std::__cxx11::string::~string(local_d0);
          std::allocator<char>::~allocator((allocator<char> *)((long)&p_2 + 7));
        }
        else if ((*this->m_curPtr == '\"') || (*this->m_curPtr == '\'')) {
          p_2._6_1_ = *this->m_curPtr;
          local_e0 = this->m_curPtr + 1;
          while (*local_e0 != p_2._6_1_) {
            if (*local_e0 == '\\') {
              local_e0 = local_e0 + 2;
            }
            else {
              local_e0 = local_e0 + 1;
            }
          }
          local_e0 = local_e0 + 1;
          this->m_curToken = TOKEN_STRING;
          pcVar5 = this->m_curPtr;
          iVar2 = (int)local_e0 - (int)pcVar5;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&ndx_1,pcVar5,(long)iVar2,&local_101);
          std::__cxx11::string::operator=((string *)&this->m_curTokenStr,(string *)&ndx_1);
          std::__cxx11::string::~string((string *)&ndx_1);
          std::allocator<char>::~allocator((allocator<char> *)&local_101);
        }
        else {
          for (local_108 = 0; local_108 < 0xc; local_108 = local_108 + 1) {
            pcVar5 = advanceToken::s_simple[local_108].str;
            __s2 = this->m_curPtr;
            __n = strlen(advanceToken::s_simple[local_108].str);
            iVar2 = strncmp(pcVar5,__s2,__n);
            if (iVar2 == 0) {
              this->m_curToken = advanceToken::s_simple[local_108].token;
              std::__cxx11::string::operator=
                        ((string *)&this->m_curTokenStr,advanceToken::s_simple[local_108].str);
              return;
            }
          }
          this->m_curToken = TOKEN_INVALID;
          std::__cxx11::string::operator=((string *)&this->m_curTokenStr,*this->m_curPtr);
        }
      }
      else {
        local_58 = this->m_curPtr;
        while (dVar1 = isNumeric(*local_58), dVar1 != 0) {
          local_58 = local_58 + 1;
        }
        if (*local_58 == '.') {
          do {
            local_58 = local_58 + 1;
            dVar1 = isNumeric(*local_58);
          } while (dVar1 != 0);
          if ((*local_58 == 'e') || (*local_58 == 'E')) {
            pcVar5 = local_58 + 1;
            if ((*pcVar5 == '+') || (*pcVar5 == '-')) {
              pcVar5 = local_58 + 2;
            }
            while (local_58 = pcVar5, dVar1 = isNumeric(*local_58), dVar1 != 0) {
              pcVar5 = local_58 + 1;
            }
          }
          this->m_curToken = TOKEN_FLOAT_LITERAL;
          pcVar5 = this->m_curPtr;
          uVar4 = (long)local_58 - (long)pcVar5;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_78,pcVar5,uVar4,&local_79);
          std::__cxx11::string::operator=((string *)&this->m_curTokenStr,local_78);
          std::__cxx11::string::~string(local_78);
          std::allocator<char>::~allocator((allocator<char> *)&local_79);
        }
        else {
          this->m_curToken = TOKEN_INT_LITERAL;
          pcVar5 = this->m_curPtr;
          uVar4 = (long)local_58 - (long)pcVar5;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_a0,pcVar5,uVar4,(allocator *)((long)&p_1 + 7));
          std::__cxx11::string::operator=((string *)&this->m_curTokenStr,local_a0);
          std::__cxx11::string::~string(local_a0);
          std::allocator<char>::~allocator((allocator<char> *)((long)&p_1 + 7));
        }
      }
    }
    else {
      local_18 = this->m_curPtr;
      do {
        local_18 = local_18 + 1;
        dVar1 = isCaseNameChar(*local_18);
      } while (dVar1 != 0);
      pcVar5 = this->m_curPtr;
      uVar4 = (long)local_18 - (long)pcVar5;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_38,pcVar5,uVar4,&local_39);
      std::__cxx11::string::operator=((string *)&this->m_curTokenStr,local_38);
      std::__cxx11::string::~string(local_38);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
      this->m_curToken = TOKEN_IDENTIFIER;
      for (p._0_4_ = 0; (int)p < 0x28; p._0_4_ = (int)p + 1) {
        bVar6 = std::operator==(&this->m_curTokenStr,advanceToken::s_named[(int)p].str);
        if (bVar6) {
          this->m_curToken = advanceToken::s_named[(int)p].token;
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void ShaderParser::advanceToken(void)
{
	// Skip old token.
	m_curPtr += m_curTokenStr.length();

	// Reset token (for safety).
	m_curToken	= TOKEN_INVALID;
	m_curTokenStr = "";

	// Eat whitespace & comments while they last.
	for (;;)
	{
		while (isWhitespace(*m_curPtr))
			m_curPtr++;

		// Check for EOL comment.
		if (*m_curPtr == '#')
		{
			while (*m_curPtr && !isEOL(*m_curPtr))
				m_curPtr++;
		}
		else
			break;
	}

	if (!*m_curPtr)
	{
		m_curToken	= TOKEN_EOF;
		m_curTokenStr = "<EOF>";
	}
	else if (isAlpha(*m_curPtr))
	{
		struct Named
		{
			const char* str;
			Token		token;
		};

		static const Named s_named[] = { { "true", TOKEN_TRUE },
										 { "false", TOKEN_FALSE },
										 { "desc", TOKEN_DESC },
										 { "expect", TOKEN_EXPECT },
										 { "group", TOKEN_GROUP },
										 { "case", TOKEN_CASE },
										 { "end", TOKEN_END },
										 { "values", TOKEN_VALUES },
										 { "both", TOKEN_BOTH },
										 { "vertex", TOKEN_VERTEX },
										 { "fragment", TOKEN_FRAGMENT },
										 { "uniform", TOKEN_UNIFORM },
										 { "input", TOKEN_INPUT },
										 { "output", TOKEN_OUTPUT },
										 { "float", TOKEN_FLOAT },
										 { "vec2", TOKEN_FLOAT_VEC2 },
										 { "vec3", TOKEN_FLOAT_VEC3 },
										 { "vec4", TOKEN_FLOAT_VEC4 },
										 { "mat2", TOKEN_FLOAT_MAT2 },
										 { "mat2x3", TOKEN_FLOAT_MAT2X3 },
										 { "mat2x4", TOKEN_FLOAT_MAT2X4 },
										 { "mat3x2", TOKEN_FLOAT_MAT3X2 },
										 { "mat3", TOKEN_FLOAT_MAT3 },
										 { "mat3x4", TOKEN_FLOAT_MAT3X4 },
										 { "mat4x2", TOKEN_FLOAT_MAT4X2 },
										 { "mat4x3", TOKEN_FLOAT_MAT4X3 },
										 { "mat4", TOKEN_FLOAT_MAT4 },
										 { "int", TOKEN_INT },
										 { "ivec2", TOKEN_INT_VEC2 },
										 { "ivec3", TOKEN_INT_VEC3 },
										 { "ivec4", TOKEN_INT_VEC4 },
										 { "uint", TOKEN_UINT },
										 { "uvec2", TOKEN_UINT_VEC2 },
										 { "uvec3", TOKEN_UINT_VEC3 },
										 { "uvec4", TOKEN_UINT_VEC4 },
										 { "bool", TOKEN_BOOL },
										 { "bvec2", TOKEN_BOOL_VEC2 },
										 { "bvec3", TOKEN_BOOL_VEC3 },
										 { "bvec4", TOKEN_BOOL_VEC4 },
										 { "version", TOKEN_VERSION } };

		const char* end = m_curPtr + 1;
		while (isCaseNameChar(*end))
			end++;
		m_curTokenStr = string(m_curPtr, end - m_curPtr);

		m_curToken = TOKEN_IDENTIFIER;

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_named); ndx++)
		{
			if (m_curTokenStr == s_named[ndx].str)
			{
				m_curToken = s_named[ndx].token;
				break;
			}
		}
	}
	else if (isNumeric(*m_curPtr))
	{
		/* \todo [2010-03-31 petri] Hex? */
		const char* p = m_curPtr;
		while (isNumeric(*p))
			p++;
		if (*p == '.')
		{
			p++;
			while (isNumeric(*p))
				p++;

			if (*p == 'e' || *p == 'E')
			{
				p++;
				if (*p == '+' || *p == '-')
					p++;
				DE_ASSERT(isNumeric(*p));
				while (isNumeric(*p))
					p++;
			}

			m_curToken	= TOKEN_FLOAT_LITERAL;
			m_curTokenStr = string(m_curPtr, p - m_curPtr);
		}
		else
		{
			m_curToken	= TOKEN_INT_LITERAL;
			m_curTokenStr = string(m_curPtr, p - m_curPtr);
		}
	}
	else if (*m_curPtr == '"' && m_curPtr[1] == '"')
	{
		const char* p = m_curPtr + 2;

		while ((p[0] != '"') || (p[1] != '"'))
		{
			DE_ASSERT(*p);
			if (*p == '\\')
			{
				DE_ASSERT(p[1] != 0);
				p += 2;
			}
			else
				p++;
		}
		p += 2;

		m_curToken	= TOKEN_SHADER_SOURCE;
		m_curTokenStr = string(m_curPtr, (int)(p - m_curPtr));
	}
	else if (*m_curPtr == '"' || *m_curPtr == '\'')
	{
		char		endChar = *m_curPtr;
		const char* p		= m_curPtr + 1;

		while (*p != endChar)
		{
			DE_ASSERT(*p);
			if (*p == '\\')
			{
				DE_ASSERT(p[1] != 0);
				p += 2;
			}
			else
				p++;
		}
		p++;

		m_curToken	= TOKEN_STRING;
		m_curTokenStr = string(m_curPtr, (int)(p - m_curPtr));
	}
	else
	{
		struct SimpleToken
		{
			const char* str;
			Token		token;
		};

		static const SimpleToken s_simple[] = { { "=", TOKEN_ASSIGN },		 { "+", TOKEN_PLUS },
												{ "-", TOKEN_MINUS },		 { ",", TOKEN_COMMA },
												{ "|", TOKEN_VERTICAL_BAR }, { ";", TOKEN_SEMI_COLON },
												{ "(", TOKEN_LEFT_PAREN },   { ")", TOKEN_RIGHT_PAREN },
												{ "[", TOKEN_LEFT_BRACKET }, { "]", TOKEN_RIGHT_BRACKET },
												{ "{", TOKEN_LEFT_BRACE },   { "}", TOKEN_RIGHT_BRACE } };

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_simple); ndx++)
		{
			if (strncmp(s_simple[ndx].str, m_curPtr, strlen(s_simple[ndx].str)) == 0)
			{
				m_curToken	= s_simple[ndx].token;
				m_curTokenStr = s_simple[ndx].str;
				return;
			}
		}

		// Otherwise invalid token.
		m_curToken	= TOKEN_INVALID;
		m_curTokenStr = *m_curPtr;
	}
}